

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson-decimal128.c
# Opt level: O0

_Bool bson_decimal128_from_string(char *string,bson_decimal128_t *dec)

{
  byte bVar1;
  bool bVar2;
  _Bool _Var3;
  ushort uVar4;
  int iVar5;
  ushort **ppuVar6;
  bool bVar7;
  bool bVar8;
  ulong local_110;
  size_t d_idx_1;
  size_t d_idx;
  int iStack_f8;
  uint8_t round_digit;
  int read_exponent;
  int nread;
  uint16_t biased_exponent;
  uint64_t significand_low;
  uint64_t significand_high;
  ulong uStack_d8;
  int32_t exponent;
  size_t last_digit;
  size_t first_digit;
  uint16_t *digits_insert;
  ushort local_b8 [3];
  uint16_t ndigits_stored;
  uint16_t digits [34];
  size_t local_68;
  size_t first_nonzero;
  size_t radix_position;
  size_t ndigits;
  size_t ndigits_read;
  size_t significant_digits;
  _Bool found_nonzero;
  _Bool includes_sign;
  _Bool saw_radix;
  char *pcStack_38;
  _Bool is_negative;
  char *str_read;
  _bson_uint128_6464_t significand;
  bson_decimal128_t *dec_local;
  char *string_local;
  
  significand.low = (uint64_t)dec;
  memset(&str_read,0,0x10);
  bVar7 = false;
  bVar1 = 0;
  significant_digits._5_1_ = 0;
  bVar2 = false;
  ndigits = 0;
  radix_position = 0;
  first_nonzero = 0;
  local_68 = 0;
  memset(local_b8,0,0x44);
  digits_insert._6_2_ = 0;
  first_digit = (size_t)local_b8;
  last_digit = 0;
  uStack_d8 = 0;
  significand_high._4_4_ = 0;
  significand_low = 0;
  _nread = 0;
  read_exponent._2_2_ = 0;
  if (significand.low == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/src/bson/bson-decimal128.c"
            ,0x1d9,"bson_decimal128_from_string","dec");
    abort();
  }
  *(undefined8 *)(significand.low + 8) = 0;
  *(undefined8 *)significand.low = 0;
  if ((*string == '+') || (pcStack_38 = string, *string == '-')) {
    pcStack_38 = string + 1;
    bVar7 = *string == '-';
    significant_digits._5_1_ = 1;
  }
  ppuVar6 = __ctype_b_loc();
  if ((((*ppuVar6)[(int)*pcStack_38] & 0x800) == 0) && (*pcStack_38 != '.')) {
    _Var3 = _dec128_istreq(pcStack_38,"inf");
    if ((_Var3) || (_Var3 = _dec128_istreq(pcStack_38,"infinity"), _Var3)) {
      *(ulong *)(significand.low + 8) = ((ulong)bVar7 << 0x3f) + 0x7800000000000000;
      *(undefined8 *)significand.low = 0;
      string_local._7_1_ = true;
    }
    else {
      _Var3 = _dec128_istreq(pcStack_38,"nan");
      if (_Var3) {
        *(undefined8 *)(significand.low + 8) = 0x7c00000000000000;
        *(undefined8 *)significand.low = 0;
        string_local._7_1_ = true;
      }
      else {
        *(undefined8 *)(significand.low + 8) = 0x7c00000000000000;
        *(undefined8 *)significand.low = 0;
        string_local._7_1_ = false;
      }
    }
  }
  else {
LAB_00118d4f:
    ppuVar6 = __ctype_b_loc();
    bVar8 = true;
    if (((*ppuVar6)[(int)*pcStack_38] & 0x800) == 0) {
      bVar8 = *pcStack_38 == '.';
    }
    if (!bVar8) {
      if ((bVar1 != 0) && (ndigits == 0)) {
        *(undefined8 *)(significand.low + 8) = 0x7c00000000000000;
        *(undefined8 *)significand.low = 0;
        return false;
      }
      if ((*pcStack_38 == 'e') || (*pcStack_38 == 'E')) {
        iStack_f8 = 0;
        iVar5 = __isoc99_sscanf(pcStack_38 + 1,"%d%n",(long)&significand_high + 4,
                                &stack0xffffffffffffff08);
        pcStack_38 = pcStack_38 + 1 + iStack_f8;
        if ((iVar5 == 0) || (iStack_f8 == 0)) {
          *(undefined8 *)(significand.low + 8) = 0x7c00000000000000;
          *(undefined8 *)significand.low = 0;
          return false;
        }
      }
      if (*pcStack_38 != '\0') {
        *(undefined8 *)(significand.low + 8) = 0x7c00000000000000;
        *(undefined8 *)significand.low = 0;
        return false;
      }
      if (digits_insert._6_2_ == 0) {
        uStack_d8 = 0;
        local_b8[0] = 0;
        radix_position = 1;
        digits_insert._6_2_ = 1;
        ndigits_read = 0;
      }
      else {
        uStack_d8 = (ulong)(int)(digits_insert._6_2_ - 1);
        ndigits_read = radix_position;
        while (string[local_68 + ndigits_read + -1 + (ulong)significant_digits._5_1_ + (ulong)bVar1]
               == '0') {
          ndigits_read = ndigits_read - 1;
        }
      }
      last_digit = 0;
      if ((first_nonzero < (ulong)(long)significand_high._4_4_) ||
         (first_nonzero - (long)significand_high._4_4_ < 0x4001)) {
        significand_high._4_4_ = significand_high._4_4_ - (int)first_nonzero;
      }
      else {
        significand_high._4_4_ = -0x1820;
      }
      for (; 0x17df < significand_high._4_4_; significand_high._4_4_ = significand_high._4_4_ + -1)
      {
        uStack_d8 = uStack_d8 + 1;
        if (0x22 < uStack_d8) {
          if (ndigits_read != 0) {
            *(undefined8 *)(significand.low + 8) = 0x7c00000000000000;
            *(undefined8 *)significand.low = 0;
            return false;
          }
          significand_high._4_4_ = 0x17df;
          break;
        }
      }
      do {
        if (-0x1821 < significand_high._4_4_ && radix_position <= digits_insert._6_2_) {
LAB_0011929e:
          if ((uStack_d8 + 1 < ndigits_read) &&
             (string[local_68 + uStack_d8 + (ulong)significant_digits._5_1_ + (ulong)bVar1 + 1] !=
              '0')) {
            *(undefined8 *)(significand.low + 8) = 0x7c00000000000000;
            *(undefined8 *)significand.low = 0;
            return false;
          }
          if (ndigits_read == 0) {
            significand_low = 0;
            _nread = 0;
          }
          else if (uStack_d8 < 0x11) {
            _nread = (ulong)local_b8[0];
            for (d_idx_1 = 1; significand_low = 0, d_idx_1 <= uStack_d8; d_idx_1 = d_idx_1 + 1) {
              _nread = (ulong)local_b8[d_idx_1] + _nread * 10;
            }
          }
          else {
            significand_low = (uint64_t)local_b8[0];
            for (local_110 = 1; local_110 <= uStack_d8 - 0x11; local_110 = local_110 + 1) {
              significand_low = (ulong)local_b8[local_110] + significand_low * 10;
            }
            _nread = (ulong)local_b8[local_110];
            while (local_110 = local_110 + 1, local_110 <= uStack_d8) {
              _nread = (ulong)local_b8[local_110] + _nread * 10;
            }
          }
          _mul_64x64(significand_low,100000000000000000,(_bson_uint128_6464_t *)&str_read);
          if (_nread + significand.high < _nread) {
            str_read = str_read + 1;
          }
          uVar4 = (short)significand_high._4_4_ + 0x1820;
          if (((ulong)str_read >> 0x31 & 1) == 0) {
            *(ulong *)(significand.low + 8) =
                 ((ulong)uVar4 & 0x3fff) << 0x31 | *(ulong *)(significand.low + 8);
            *(ulong *)(significand.low + 8) =
                 (ulong)str_read & 0x1ffffffffffff | *(ulong *)(significand.low + 8);
          }
          else {
            *(ulong *)(significand.low + 8) = *(ulong *)(significand.low + 8) | 0x6000000000000000;
            *(ulong *)(significand.low + 8) =
                 ((ulong)uVar4 & 0x3fff) << 0x2f | *(ulong *)(significand.low + 8);
            *(ulong *)(significand.low + 8) =
                 (ulong)str_read & 0x7fffffffffff | *(ulong *)(significand.low + 8);
          }
          *(ulong *)significand.low = _nread + significand.high;
          if (bVar7) {
            *(ulong *)(significand.low + 8) = *(ulong *)(significand.low + 8) | 0x8000000000000000;
          }
          return true;
        }
        if (uStack_d8 == 0) {
          if (ndigits_read != 0) {
            *(undefined8 *)(significand.low + 8) = 0x7c00000000000000;
            *(undefined8 *)significand.low = 0;
            return false;
          }
          significand_high._4_4_ = -0x1820;
          goto LAB_0011929e;
        }
        if (digits_insert._6_2_ < radix_position) {
          if ((string[(radix_position - 1) + (ulong)significant_digits._5_1_ + (ulong)bVar1] != '0')
             && (ndigits_read != 0)) {
            *(undefined8 *)(significand.low + 8) = 0x7c00000000000000;
            *(undefined8 *)significand.low = 0;
            return false;
          }
          radix_position = radix_position - 1;
        }
        else {
          if (local_b8[uStack_d8] != 0) {
            *(undefined8 *)(significand.low + 8) = 0x7c00000000000000;
            *(undefined8 *)significand.low = 0;
            return false;
          }
          uStack_d8 = uStack_d8 - 1;
        }
        if (0x17de < significand_high._4_4_) {
          *(undefined8 *)(significand.low + 8) = 0x7c00000000000000;
          *(undefined8 *)significand.low = 0;
          return false;
        }
        significand_high._4_4_ = significand_high._4_4_ + 1;
      } while( true );
    }
    if (*pcStack_38 != '.') {
      if ((digits_insert._6_2_ < 0x22) && ((*pcStack_38 != '0' || (bVar2)))) {
        if (!bVar2) {
          local_68 = ndigits;
        }
        bVar2 = true;
        *(short *)first_digit = *pcStack_38 + -0x30;
        digits_insert._6_2_ = digits_insert._6_2_ + 1;
        first_digit = first_digit + 2;
      }
      if (bVar2) {
        radix_position = radix_position + 1;
      }
      if (bVar1 != 0) {
        first_nonzero = first_nonzero + 1;
      }
      ndigits = ndigits + 1;
      pcStack_38 = pcStack_38 + 1;
      goto LAB_00118d4f;
    }
    if (bVar1 == 0) {
      bVar1 = 1;
      pcStack_38 = pcStack_38 + 1;
      goto LAB_00118d4f;
    }
    *(undefined8 *)(significand.low + 8) = 0x7c00000000000000;
    *(undefined8 *)significand.low = 0;
    string_local._7_1_ = false;
  }
  return string_local._7_1_;
}

Assistant:

bool
bson_decimal128_from_string (const char *string,     /* IN */
                             bson_decimal128_t *dec) /* OUT */
{
   _bson_uint128_6464_t significand = {0};

   const char *str_read = string; /* Read pointer for consuming str. */

   /* Parsing state tracking */
   bool is_negative = false;
   bool saw_radix = false;
   bool includes_sign = false; /* True if the input string contains a sign. */
   bool found_nonzero = false;

   size_t significant_digits = 0; /* Total number of significant digits
                                   * (no leading or trailing zero) */
   size_t ndigits_read = 0;       /* Total number of significand digits read */
   size_t ndigits = 0;        /* Total number of digits (no leading zeros) */
   size_t radix_position = 0; /* The number of the digits after radix */
   size_t first_nonzero = 0;  /* The index of the first non-zero in *str* */

   uint16_t digits[BSON_DECIMAL128_MAX_DIGITS] = {0};
   uint16_t ndigits_stored = 0;      /* The number of digits in digits */
   uint16_t *digits_insert = digits; /* Insertion pointer for digits */
   size_t first_digit = 0;           /* The index of the first non-zero digit */
   size_t last_digit = 0;            /* The index of the last digit */

   int32_t exponent = 0;
   uint64_t significand_high = 0; /* The high 17 digits of the significand */
   uint64_t significand_low = 0;  /* The low 17 digits of the significand */
   uint16_t biased_exponent = 0;  /* The biased exponent */

   BSON_ASSERT (dec);
   dec->high = 0;
   dec->low = 0;

   if (*str_read == '+' || *str_read == '-') {
      is_negative = *(str_read++) == '-';
      includes_sign = true;
   }

   /* Check for Infinity or NaN */
   if (!isdigit (*str_read) && *str_read != '.') {
      if (_dec128_istreq (str_read, "inf") ||
          _dec128_istreq (str_read, "infinity")) {
         BSON_DECIMAL128_SET_INF (*dec, is_negative);
         return true;
      } else if (_dec128_istreq (str_read, "nan")) {
         BSON_DECIMAL128_SET_NAN (*dec);
         return true;
      }

      BSON_DECIMAL128_SET_NAN (*dec);
      return false;
   }

   /* Read digits */
   while (isdigit (*str_read) || *str_read == '.') {
      if (*str_read == '.') {
         if (saw_radix) {
            BSON_DECIMAL128_SET_NAN (*dec);
            return false;
         }

         saw_radix = true;
         str_read++;
         continue;
      }

      if (ndigits_stored < 34) {
         if (*str_read != '0' || found_nonzero) {
            if (!found_nonzero) {
               first_nonzero = ndigits_read;
            }

            found_nonzero = true;
            *(digits_insert++) = *(str_read) - '0'; /* Only store 34 digits */
            ndigits_stored++;
         }
      }

      if (found_nonzero) {
         ndigits++;
      }

      if (saw_radix) {
         radix_position++;
      }

      ndigits_read++;
      str_read++;
   }

   if (saw_radix && !ndigits_read) {
      BSON_DECIMAL128_SET_NAN (*dec);
      return false;
   }

   /* Read exponent if exists */
   if (*str_read == 'e' || *str_read == 'E') {
      int nread = 0;
#ifdef _MSC_VER
#define SSCANF sscanf_s
#else
#define SSCANF sscanf
#endif
      int read_exponent = SSCANF (++str_read, "%d%n", &exponent, &nread);
      str_read += nread;

      if (!read_exponent || nread == 0) {
         BSON_DECIMAL128_SET_NAN (*dec);
         return false;
      }

#undef SSCANF
   }

   if (*str_read) {
      BSON_DECIMAL128_SET_NAN (*dec);
      return false;
   }

   /* Done reading input. */
   /* Find first non-zero digit in digits */
   first_digit = 0;

   if (!ndigits_stored) { /* value is zero */
      first_digit = 0;
      last_digit = 0;
      digits[0] = 0;
      ndigits = 1;
      ndigits_stored = 1;
      significant_digits = 0;
   } else {
      last_digit = ndigits_stored - 1;
      significant_digits = ndigits;
      /* Mark trailing zeros as non-significant */
      while (string[first_nonzero + significant_digits - 1 + includes_sign +
                    saw_radix] == '0') {
         significant_digits--;
      }
   }


   /* Normalization of exponent */
   /* Correct exponent based on radix position, and shift significand as needed
    */
   /* to represent user input */

   /* Overflow prevention */
   if (exponent <= radix_position && radix_position - exponent > (1 << 14)) {
      exponent = BSON_DECIMAL128_EXPONENT_MIN;
   } else {
      exponent -= radix_position;
   }

   /* Attempt to normalize the exponent */
   while (exponent > BSON_DECIMAL128_EXPONENT_MAX) {
      /* Shift exponent to significand and decrease */
      last_digit++;

      if (last_digit - first_digit > BSON_DECIMAL128_MAX_DIGITS) {
         /* The exponent is too great to shift into the significand. */
         if (significant_digits == 0) {
            /* Value is zero, we are allowed to clamp the exponent. */
            exponent = BSON_DECIMAL128_EXPONENT_MAX;
            break;
         }

         /* Overflow is not permitted, error. */
         BSON_DECIMAL128_SET_NAN (*dec);
         return false;
      }

      exponent--;
   }

   while (exponent < BSON_DECIMAL128_EXPONENT_MIN || ndigits_stored < ndigits) {
      /* Shift last digit */
      if (last_digit == 0) {
         /* underflow is not allowed, but zero clamping is */
         if (significant_digits == 0) {
            exponent = BSON_DECIMAL128_EXPONENT_MIN;
            break;
         }

         BSON_DECIMAL128_SET_NAN (*dec);
         return false;
      }

      if (ndigits_stored < ndigits) {
         if (string[ndigits - 1 + includes_sign + saw_radix] - '0' != 0 &&
             significant_digits != 0) {
            BSON_DECIMAL128_SET_NAN (*dec);
            return false;
         }

         ndigits--; /* adjust to match digits not stored */
      } else {
         if (digits[last_digit] != 0) {
            /* Inexact rounding is not allowed. */
            BSON_DECIMAL128_SET_NAN (*dec);
            return false;
         }


         last_digit--; /* adjust to round */
      }

      if (exponent < BSON_DECIMAL128_EXPONENT_MAX) {
         exponent++;
      } else {
         BSON_DECIMAL128_SET_NAN (*dec);
         return false;
      }
   }

   /* Round */
   /* We've normalized the exponent, but might still need to round. */
   if (last_digit - first_digit + 1 < significant_digits) {
      uint8_t round_digit;

      /* There are non-zero digits after last_digit that need rounding. */
      /* We round to nearest, ties to even */
      round_digit =
         string[first_nonzero + last_digit + includes_sign + saw_radix + 1] -
         '0';

      if (round_digit != 0) {
         /* Inexact (non-zero) rounding is not allowed */
         BSON_DECIMAL128_SET_NAN (*dec);
         return false;
      }
   }

   /* Encode significand */
   significand_high = 0,   /* The high 17 digits of the significand */
      significand_low = 0; /* The low 17 digits of the significand */

   if (significant_digits == 0) { /* read a zero */
      significand_high = 0;
      significand_low = 0;
   } else if (last_digit - first_digit < 17) {
      size_t d_idx = first_digit;
      significand_low = digits[d_idx++];

      for (; d_idx <= last_digit; d_idx++) {
         significand_low *= 10;
         significand_low += digits[d_idx];
         significand_high = 0;
      }
   } else {
      size_t d_idx = first_digit;
      significand_high = digits[d_idx++];

      for (; d_idx <= last_digit - 17; d_idx++) {
         significand_high *= 10;
         significand_high += digits[d_idx];
      }

      significand_low = digits[d_idx++];

      for (; d_idx <= last_digit; d_idx++) {
         significand_low *= 10;
         significand_low += digits[d_idx];
      }
   }

   _mul_64x64 (significand_high, 100000000000000000ull, &significand);
   significand.low += significand_low;

   if (significand.low < significand_low) {
      significand.high += 1;
   }


   biased_exponent = (exponent + (int16_t) BSON_DECIMAL128_EXPONENT_BIAS);

   /* Encode combination, exponent, and significand. */
   if ((significand.high >> 49) & 1) {
      /* Encode '11' into bits 1 to 3 */
      dec->high |= (0x3ull << 61);
      dec->high |= (biased_exponent & 0x3fffull) << 47;
      dec->high |= significand.high & 0x7fffffffffffull;
   } else {
      dec->high |= (biased_exponent & 0x3fffull) << 49;
      dec->high |= significand.high & 0x1ffffffffffffull;
   }

   dec->low = significand.low;

   /* Encode sign */
   if (is_negative) {
      dec->high |= 0x8000000000000000ull;
   }

   return true;
}